

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O0

typed_value<std::vector<bool,_std::allocator<bool>_>,_char> * __thiscall
VW::config::options_boost_po::convert_to_boost_value<bool>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<bool>_> *opt)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  bool bVar1;
  string *pmessage;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *ptVar2;
  undefined8 in_RDI;
  stringstream __msg;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *value;
  int plineNumber;
  undefined7 in_stack_fffffffffffffda8;
  value_semantic_codecvt_helper<char> in_stack_fffffffffffffdaf;
  value_semantic_codecvt_helper<char> vVar3;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  iterator pbVar4;
  size_type in_stack_fffffffffffffdc0;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  options_boost_po *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  _Alloc_hider in_stack_fffffffffffffdef;
  options_boost_po *in_stack_fffffffffffffdf0;
  stringstream local_1a0 [16];
  ostream local_190;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *local_18;
  
  plineNumber = (int)((ulong)in_RDI >> 0x20);
  local_18 = get_base_boost_value<bool>
                       (in_stack_fffffffffffffdf0,
                        (shared_ptr<VW::config::typed_option<bool>_> *)
                        CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::__shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x154656);
  bVar1 = typed_option<bool>::default_value_supplied((typed_option<bool> *)0x15465e);
  if (!bVar1) {
    std::allocator<bool>::allocator((allocator<bool> *)0x1547ab);
    __l._M_len = in_stack_fffffffffffffdc0;
    __l._M_array = in_stack_fffffffffffffdb8;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffdb0,__l,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    default_value(in_stack_fffffffffffffdb0,
                  (vector<bool,_std::allocator<bool>_> *)
                  CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1547ed);
    std::allocator<bool>::~allocator((allocator<bool> *)0x1547f7);
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::zero_tokens
              (local_18);
    vVar3 = (value_semantic_codecvt_helper<char>)0x1;
    ptVar2 = (typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *)&stack0xfffffffffffffdaf
    ;
    pbVar4 = (iterator)0x1;
    std::allocator<bool>::allocator((allocator<bool> *)0x154837);
    __l_00._M_len = in_stack_fffffffffffffdc0;
    __l_00._M_array = pbVar4;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)ptVar2,__l_00,
               (allocator_type *)CONCAT17(vVar3,in_stack_fffffffffffffda8));
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    implicit_value(ptVar2,(vector<bool,_std::allocator<bool>_> *)
                          CONCAT17(vVar3,in_stack_fffffffffffffda8));
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x15486c);
    std::allocator<bool>::~allocator((allocator<bool> *)0x154876);
    ptVar2 = add_notifier<bool>(in_stack_fffffffffffffde0,
                                (shared_ptr<VW::config::typed_option<bool>_> *)
                                in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    return ptVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "Using a bool option type acts as a switch, no explicit default value is allowed."
                 );
  pmessage = (string *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception
            ((vw_exception *)in_stack_fffffffffffffdb0,
             (char *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),plineNumber,
             pmessage);
  __cxa_throw(pmessage,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

po::typed_value<std::vector<bool>>* options_boost_po::convert_to_boost_value(std::shared_ptr<typed_option<bool>>& opt)
{
  auto value = get_base_boost_value(opt);

  if (opt->default_value_supplied())
  {
    THROW("Using a bool option type acts as a switch, no explicit default value is allowed.")
  }

  value->default_value({false});
  value->zero_tokens();
  value->implicit_value({true});

  return add_notifier(opt, value);
}